

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneCombiner.cpp
# Opt level: O0

void Assimp::SceneCombiner::MergeBones(aiMesh *out,const_iterator it,const_iterator end)

{
  uint uVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  size_type sVar4;
  ulong uVar5;
  void *pvVar6;
  aiBone *paVar7;
  pointer pBVar8;
  Logger *this;
  pointer ppVar9;
  pair<aiBone_*,_unsigned_int> *ppVar10;
  reference pBVar11;
  reference ppVar12;
  aiVertexWeight *paVar13;
  pair<aiBone_*,_unsigned_int> *local_518;
  bool local_4e9;
  aiVertexWeight *vfi;
  uint mp;
  aiBone *pip;
  __normal_iterator<const_std::pair<aiBone_*,_unsigned_int>_*,_std::vector<std::pair<aiBone_*,_unsigned_int>,_std::allocator<std::pair<aiBone_*,_unsigned_int>_>_>_>
  local_4b0;
  const_iterator wmit_1;
  aiVertexWeight *avw;
  __normal_iterator<const_std::pair<aiBone_*,_unsigned_int>_*,_std::vector<std::pair<aiBone_*,_unsigned_int>,_std::allocator<std::pair<aiBone_*,_unsigned_int>_>_>_>
  local_498;
  const_iterator wmit;
  const_iterator wend;
  aiBone *pc;
  _List_const_iterator<Assimp::BoneWithHash> local_70;
  const_iterator boneEnd;
  _List_const_iterator<Assimp::BoneWithHash> local_60;
  const_iterator boneIt;
  undefined1 local_38 [8];
  list<Assimp::BoneWithHash,_std::allocator<Assimp::BoneWithHash>_> asBones;
  aiMesh *out_local;
  const_iterator end_local;
  const_iterator it_local;
  
  if ((out != (aiMesh *)0x0) && (out->mNumBones != 0)) {
    asBones.super__List_base<Assimp::BoneWithHash,_std::allocator<Assimp::BoneWithHash>_>._M_impl.
    _M_node._M_size = (size_t)out;
    std::__cxx11::list<Assimp::BoneWithHash,_std::allocator<Assimp::BoneWithHash>_>::list
              ((list<Assimp::BoneWithHash,_std::allocator<Assimp::BoneWithHash>_> *)local_38);
    BuildUniqueBoneList((list<Assimp::BoneWithHash,_std::allocator<Assimp::BoneWithHash>_> *)
                        local_38,it,end);
    *(undefined4 *)
     (asBones.super__List_base<Assimp::BoneWithHash,_std::allocator<Assimp::BoneWithHash>_>._M_impl.
      _M_node._M_size + 0xd8) = 0;
    sVar4 = std::__cxx11::list<Assimp::BoneWithHash,_std::allocator<Assimp::BoneWithHash>_>::size
                      ((list<Assimp::BoneWithHash,_std::allocator<Assimp::BoneWithHash>_> *)local_38
                      );
    auVar2._8_8_ = 0;
    auVar2._0_8_ = sVar4;
    uVar5 = SUB168(auVar2 * ZEXT816(8),0);
    if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
      uVar5 = 0xffffffffffffffff;
    }
    pvVar6 = operator_new__(uVar5);
    *(void **)(asBones.super__List_base<Assimp::BoneWithHash,_std::allocator<Assimp::BoneWithHash>_>
               ._M_impl._M_node._M_size + 0xe0) = pvVar6;
    boneEnd._M_node =
         (_List_node_base *)
         std::__cxx11::list<Assimp::BoneWithHash,_std::allocator<Assimp::BoneWithHash>_>::begin
                   ((list<Assimp::BoneWithHash,_std::allocator<Assimp::BoneWithHash>_> *)local_38);
    std::_List_const_iterator<Assimp::BoneWithHash>::_List_const_iterator
              (&local_60,(iterator *)&boneEnd);
    pc = (aiBone *)
         std::__cxx11::list<Assimp::BoneWithHash,_std::allocator<Assimp::BoneWithHash>_>::end
                   ((list<Assimp::BoneWithHash,_std::allocator<Assimp::BoneWithHash>_> *)local_38);
    std::_List_const_iterator<Assimp::BoneWithHash>::_List_const_iterator(&local_70,(iterator *)&pc)
    ;
    while (bVar3 = std::operator!=(&local_60,&local_70), bVar3) {
      paVar7 = (aiBone *)operator_new(0x460);
      aiBone::aiBone(paVar7);
      uVar1 = *(uint *)(asBones.
                        super__List_base<Assimp::BoneWithHash,_std::allocator<Assimp::BoneWithHash>_>
                        ._M_impl._M_node._M_size + 0xd8);
      *(uint *)(asBones.
                super__List_base<Assimp::BoneWithHash,_std::allocator<Assimp::BoneWithHash>_>.
                _M_impl._M_node._M_size + 0xd8) = uVar1 + 1;
      *(aiBone **)
       (*(long *)(asBones.
                  super__List_base<Assimp::BoneWithHash,_std::allocator<Assimp::BoneWithHash>_>.
                  _M_impl._M_node._M_size + 0xe0) + (ulong)uVar1 * 8) = paVar7;
      pBVar8 = std::_List_const_iterator<Assimp::BoneWithHash>::operator->(&local_60);
      aiString::aiString((aiString *)((long)&wend._M_current + 4),
                         (pBVar8->super_pair<unsigned_int,_aiString_*>).second);
      aiString::operator=((aiString *)paVar7,(aiString *)((long)&wend._M_current + 4));
      pBVar8 = std::_List_const_iterator<Assimp::BoneWithHash>::operator->(&local_60);
      wmit = std::
             vector<std::pair<aiBone_*,_unsigned_int>,_std::allocator<std::pair<aiBone_*,_unsigned_int>_>_>
             ::end(&pBVar8->pSrcBones);
      pBVar8 = std::_List_const_iterator<Assimp::BoneWithHash>::operator->(&local_60);
      local_498._M_current =
           (pair<aiBone_*,_unsigned_int> *)
           std::
           vector<std::pair<aiBone_*,_unsigned_int>,_std::allocator<std::pair<aiBone_*,_unsigned_int>_>_>
           ::begin(&pBVar8->pSrcBones);
      while (bVar3 = __gnu_cxx::operator!=(&local_498,&wmit), bVar3) {
        ppVar12 = __gnu_cxx::
                  __normal_iterator<const_std::pair<aiBone_*,_unsigned_int>_*,_std::vector<std::pair<aiBone_*,_unsigned_int>,_std::allocator<std::pair<aiBone_*,_unsigned_int>_>_>_>
                  ::operator*(&local_498);
        paVar7->mNumWeights = ppVar12->first->mNumWeights + paVar7->mNumWeights;
        pBVar8 = std::_List_const_iterator<Assimp::BoneWithHash>::operator->(&local_60);
        avw = (aiVertexWeight *)
              std::
              vector<std::pair<aiBone_*,_unsigned_int>,_std::allocator<std::pair<aiBone_*,_unsigned_int>_>_>
              ::begin(&pBVar8->pSrcBones);
        bVar3 = __gnu_cxx::operator!=
                          (&local_498,
                           (__normal_iterator<const_std::pair<aiBone_*,_unsigned_int>_*,_std::vector<std::pair<aiBone_*,_unsigned_int>,_std::allocator<std::pair<aiBone_*,_unsigned_int>_>_>_>
                            *)&avw);
        local_4e9 = false;
        if (bVar3) {
          ppVar9 = __gnu_cxx::
                   __normal_iterator<const_std::pair<aiBone_*,_unsigned_int>_*,_std::vector<std::pair<aiBone_*,_unsigned_int>,_std::allocator<std::pair<aiBone_*,_unsigned_int>_>_>_>
                   ::operator->(&local_498);
          local_4e9 = aiMatrix4x4t<float>::operator!=
                                (&paVar7->mOffsetMatrix,&ppVar9->first->mOffsetMatrix);
        }
        if (local_4e9 == false) {
          ppVar9 = __gnu_cxx::
                   __normal_iterator<const_std::pair<aiBone_*,_unsigned_int>_*,_std::vector<std::pair<aiBone_*,_unsigned_int>,_std::allocator<std::pair<aiBone_*,_unsigned_int>_>_>_>
                   ::operator->(&local_498);
          memcpy(&paVar7->mOffsetMatrix,&ppVar9->first->mOffsetMatrix,0x40);
        }
        else {
          this = DefaultLogger::get();
          Logger::warn(this,
                       "Bones with equal names but different offset matrices can\'t be joined at the moment"
                      );
        }
        __gnu_cxx::
        __normal_iterator<const_std::pair<aiBone_*,_unsigned_int>_*,_std::vector<std::pair<aiBone_*,_unsigned_int>,_std::allocator<std::pair<aiBone_*,_unsigned_int>_>_>_>
        ::operator++(&local_498);
      }
      uVar5 = (ulong)paVar7->mNumWeights;
      ppVar10 = (pair<aiBone_*,_unsigned_int> *)operator_new__(uVar5 << 3);
      if (uVar5 != 0) {
        local_518 = ppVar10;
        do {
          aiVertexWeight::aiVertexWeight((aiVertexWeight *)local_518);
          local_518 = (pair<aiBone_*,_unsigned_int> *)&local_518->second;
        } while (local_518 != (pair<aiBone_*,_unsigned_int> *)(&ppVar10->first + uVar5));
      }
      paVar7->mWeights = (aiVertexWeight *)ppVar10;
      wmit_1._M_current = ppVar10;
      pBVar11 = std::_List_const_iterator<Assimp::BoneWithHash>::operator*(&local_60);
      local_4b0._M_current =
           (pair<aiBone_*,_unsigned_int> *)
           std::
           vector<std::pair<aiBone_*,_unsigned_int>,_std::allocator<std::pair<aiBone_*,_unsigned_int>_>_>
           ::begin(&pBVar11->pSrcBones);
      while( true ) {
        pBVar11 = std::_List_const_iterator<Assimp::BoneWithHash>::operator*(&local_60);
        pip = (aiBone *)
              std::
              vector<std::pair<aiBone_*,_unsigned_int>,_std::allocator<std::pair<aiBone_*,_unsigned_int>_>_>
              ::end(&pBVar11->pSrcBones);
        bVar3 = __gnu_cxx::operator!=
                          (&local_4b0,
                           (__normal_iterator<const_std::pair<aiBone_*,_unsigned_int>_*,_std::vector<std::pair<aiBone_*,_unsigned_int>,_std::allocator<std::pair<aiBone_*,_unsigned_int>_>_>_>
                            *)&pip);
        if ((!bVar3) || (bVar3 = __gnu_cxx::operator==(&local_4b0,&wmit), bVar3)) break;
        ppVar12 = __gnu_cxx::
                  __normal_iterator<const_std::pair<aiBone_*,_unsigned_int>_*,_std::vector<std::pair<aiBone_*,_unsigned_int>,_std::allocator<std::pair<aiBone_*,_unsigned_int>_>_>_>
                  ::operator*(&local_4b0);
        paVar7 = ppVar12->first;
        for (vfi._4_4_ = 0; vfi._4_4_ < paVar7->mNumWeights; vfi._4_4_ = vfi._4_4_ + 1) {
          paVar13 = paVar7->mWeights + vfi._4_4_;
          *(float *)((long)&(wmit_1._M_current)->first + 4) = paVar13->mWeight;
          uVar1 = paVar13->mVertexId;
          ppVar12 = __gnu_cxx::
                    __normal_iterator<const_std::pair<aiBone_*,_unsigned_int>_*,_std::vector<std::pair<aiBone_*,_unsigned_int>,_std::allocator<std::pair<aiBone_*,_unsigned_int>_>_>_>
                    ::operator*(&local_4b0);
          *(uint *)&(wmit_1._M_current)->first = uVar1 + ppVar12->second;
          wmit_1._M_current = (pair<aiBone_*,_unsigned_int> *)&(wmit_1._M_current)->second;
        }
        __gnu_cxx::
        __normal_iterator<const_std::pair<aiBone_*,_unsigned_int>_*,_std::vector<std::pair<aiBone_*,_unsigned_int>,_std::allocator<std::pair<aiBone_*,_unsigned_int>_>_>_>
        ::operator++(&local_4b0);
      }
      std::_List_const_iterator<Assimp::BoneWithHash>::operator++(&local_60);
    }
    std::__cxx11::list<Assimp::BoneWithHash,_std::allocator<Assimp::BoneWithHash>_>::~list
              ((list<Assimp::BoneWithHash,_std::allocator<Assimp::BoneWithHash>_> *)local_38);
  }
  return;
}

Assistant:

void SceneCombiner::MergeBones(aiMesh* out,std::vector<aiMesh*>::const_iterator it,
    std::vector<aiMesh*>::const_iterator end)
{
    if ( nullptr == out || out->mNumBones == 0 ) {
        return;
    }

    // find we need to build an unique list of all bones.
    // we work with hashes to make the comparisons MUCH faster,
    // at least if we have many bones.
    std::list<BoneWithHash> asBones;
    BuildUniqueBoneList( asBones, it, end );

    // now create the output bones
    out->mNumBones = 0;
    out->mBones = new aiBone*[asBones.size()];

    for (std::list<BoneWithHash>::const_iterator boneIt = asBones.begin(),boneEnd = asBones.end(); boneIt != boneEnd; ++boneIt )  {
        // Allocate a bone and setup it's name
        aiBone* pc = out->mBones[out->mNumBones++] = new aiBone();
        pc->mName = aiString( *( boneIt->second ));

        std::vector< BoneSrcIndex >::const_iterator wend = boneIt->pSrcBones.end();

        // Loop through all bones to be joined for this bone
        for (std::vector< BoneSrcIndex >::const_iterator wmit = boneIt->pSrcBones.begin(); wmit != wend; ++wmit)  {
            pc->mNumWeights += (*wmit).first->mNumWeights;

            // NOTE: different offset matrices for bones with equal names
            // are - at the moment - not handled correctly.
            if (wmit != boneIt->pSrcBones.begin() && pc->mOffsetMatrix != wmit->first->mOffsetMatrix) {
                ASSIMP_LOG_WARN("Bones with equal names but different offset matrices can't be joined at the moment");
                continue;
            }
            pc->mOffsetMatrix = wmit->first->mOffsetMatrix;
        }

        // Allocate the vertex weight array
        aiVertexWeight* avw = pc->mWeights = new aiVertexWeight[pc->mNumWeights];

        // And copy the final weights - adjust the vertex IDs by the
        // face index offset of the corresponding mesh.
        for (std::vector< BoneSrcIndex >::const_iterator wmit = (*boneIt).pSrcBones.begin(); wmit != (*boneIt).pSrcBones.end(); ++wmit) {
            if (wmit == wend) {
                break;
            }

            aiBone* pip = (*wmit).first;
            for (unsigned int mp = 0; mp < pip->mNumWeights;++mp,++avw) {
                const aiVertexWeight& vfi = pip->mWeights[mp];
                avw->mWeight = vfi.mWeight;
                avw->mVertexId = vfi.mVertexId + (*wmit).second;
            }
        }
    }
}